

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::CoverageBinSymbol::resolve(CoverageBinSymbol *this)

{
  string_view *psVar1;
  SourceRange *pSVar2;
  SyntaxKind SVar3;
  basic_string_view<char,_std::char_traits<char>_> __y;
  CoverageBinsSyntax *this_00;
  bool bVar4;
  int iVar5;
  SyntaxNode *pSVar6;
  Scope *this_01;
  ExpressionSyntax *pEVar7;
  undefined4 extraout_var;
  BinsSelectExpressionSyntax *pBVar8;
  undefined4 extraout_var_00;
  Symbol *this_02;
  undefined4 extraout_var_01;
  Expression *pEVar9;
  CoverageBinInitializerSyntax *pCVar10;
  RangeCoverageBinInitializerSyntax *pRVar11;
  OpenRangeListSyntax *pOVar12;
  undefined4 extraout_var_02;
  WithClauseSyntax *withSyntax;
  Diagnostic *pDVar13;
  TransListCoverageBinInitializerSyntax *pTVar14;
  SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *this_03;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ExpressionCoverageBinInitializerSyntax *pEVar15;
  Type *rhs;
  logic_error *this_04;
  socklen_t __len;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  LookupLocation LVar16;
  iterator iVar17;
  SourceRange sourceRange;
  iterator iVar18;
  iterator iVar19;
  string local_4d8;
  allocator<char> local_4b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  size_t local_410;
  char *local_408;
  SourceLocation local_400;
  SourceLocation local_3f8;
  undefined4 local_3ec;
  Diagnostic *local_3e8;
  Diagnostic *diag;
  Type *t;
  span<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>
  local_3d0;
  span<const_nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>
  local_3c0;
  span<slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> local_3b0;
  span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> local_3a0;
  TransRangeSyntax *local_390;
  TransRangeSyntax *rangeElem;
  iterator __end4;
  iterator __begin4;
  SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *__range4;
  SmallVector<slang::ast::CoverageBinSymbol::TransRangeList,_4UL> setBuffer;
  TransSetSyntax *setElem;
  iterator __end3_1;
  iterator __begin3_1;
  SeparatedSyntaxList<slang::syntax::TransSetSyntax> *__range3_1;
  SmallVector<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_4UL>
  listBuffer;
  undefined1 local_1d8 [8];
  string_view targetName;
  IdWithExprCoverageBinInitializerSyntax *iwecbi;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_1b0;
  Expression *local_1a0;
  underlying_type local_198;
  Expression *local_190;
  Expression *expr;
  bitmask<slang::ast::ASTFlags> local_180;
  bitmask<slang::ast::ASTFlags> flags;
  ExpressionSyntax *elem;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range3;
  RangeCoverageBinInitializerSyntax *rcbis;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  not_null<slang::syntax::CoverageBinInitializerSyntax_*> init;
  anon_class_40_5_a2b3541b bindWithExpr;
  bitmask<slang::ast::ASTFlags> local_b8;
  CoverageBinsSyntax *local_b0;
  CoverageBinsSyntax *binsSyntax;
  Type *type;
  CoverpointSymbol *coverpoint;
  BinsSelectionSyntax *local_90;
  BinsSelectionSyntax *binsSyntax_1;
  Scope *local_80;
  uint32_t local_78;
  Scope *local_70;
  uint32_t local_68;
  undefined1 local_60 [8];
  ASTContext context;
  Compilation *comp;
  Scope *scope;
  SyntaxNode *syntax;
  CoverageBinSymbol *this_local;
  
  if ((this->isResolved & 1U) != 0) {
    assert::assertFailed
              ("!isResolved",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
               ,0x1db,"void slang::ast::CoverageBinSymbol::resolve() const");
  }
  this->isResolved = true;
  pSVar6 = Symbol::getSyntax(&this->super_Symbol);
  this_01 = Symbol::getParentScope(&this->super_Symbol);
  if ((pSVar6 != (SyntaxNode *)0x0) && (this_01 != (Scope *)0x0)) {
    context.assertionInstance = (AssertionInstanceDetails *)Scope::getCompilation(this_01);
    LVar16 = LookupLocation::before(&this->super_Symbol);
    local_80 = LVar16.scope;
    local_78 = LVar16.index;
    local_70 = local_80;
    local_68 = local_78;
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&binsSyntax_1,None);
    LVar16.index = local_68;
    LVar16.scope = local_70;
    LVar16._12_4_ = 0;
    ASTContext::ASTContext
              ((ASTContext *)local_60,this_01,LVar16,(bitmask<slang::ast::ASTFlags>)binsSyntax_1);
    if (pSVar6->kind == BinsSelection) {
      local_90 = slang::syntax::SyntaxNode::as<slang::syntax::BinsSelectionSyntax>(pSVar6);
      if (local_90->iff != (CoverageIffClauseSyntax *)0x0) {
        pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&local_90->iff->expr);
        bitmask<slang::ast::ASTFlags>::bitmask
                  ((bitmask<slang::ast::ASTFlags> *)&coverpoint,AllowCoverageSampleFormal);
        iVar5 = Expression::bind((int)pEVar7,(sockaddr *)local_60,(socklen_t)coverpoint);
        this->iffExpr = (Expression *)CONCAT44(extraout_var,iVar5);
        ASTContext::requireBooleanConvertible((ASTContext *)local_60,this->iffExpr);
      }
      pBVar8 = not_null<slang::syntax::BinsSelectExpressionSyntax_*>::operator*(&local_90->expr);
      iVar5 = BinsSelectExpr::bind((int)pBVar8,(sockaddr *)local_60,__len);
      this->selectExpr = (BinsSelectExpr *)CONCAT44(extraout_var_00,iVar5);
    }
    else {
      this_02 = Scope::asSymbol(this_01);
      type = (Type *)Symbol::as<slang::ast::CoverpointSymbol>(this_02);
      binsSyntax = (CoverageBinsSyntax *)CoverpointSymbol::getType((CoverpointSymbol *)type);
      local_b0 = slang::syntax::SyntaxNode::as<slang::syntax::CoverageBinsSyntax>(pSVar6);
      if (local_b0->iff != (CoverageIffClauseSyntax *)0x0) {
        pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&local_b0->iff->expr);
        bitmask<slang::ast::ASTFlags>::bitmask(&local_b8,AllowCoverageSampleFormal);
        iVar5 = Expression::bind((int)pEVar7,(sockaddr *)local_60,(socklen_t)local_b8.m_bits);
        this->iffExpr = (Expression *)CONCAT44(extraout_var_01,iVar5);
        ASTContext::requireBooleanConvertible((ASTContext *)local_60,this->iffExpr);
      }
      if ((local_b0->size != (CoverageBinsArraySizeSyntax *)0x0) &&
         (local_b0->size->expr != (ExpressionSyntax *)0x0)) {
        pEVar7 = local_b0->size->expr;
        memset(&bindWithExpr.this,0,8);
        bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&bindWithExpr.this);
        pEVar9 = bindCovergroupExpr(pEVar7,(ASTContext *)local_60,(Type *)0x0,
                                    (bitmask<slang::ast::ASTFlags>)bindWithExpr.this);
        this->numberOfBinsExpr = pEVar9;
        ASTContext::requireIntegral((ASTContext *)local_60,this->numberOfBinsExpr);
      }
      init.ptr = (CoverageBinInitializerSyntax *)context.assertionInstance;
      bindWithExpr.comp = (Compilation *)local_60;
      bindWithExpr.context = (ASTContext *)type;
      bindWithExpr.coverpoint = (CoverpointSymbol *)binsSyntax;
      buffer.stackBase._24_8_ = (local_b0->initializer).ptr;
      bindWithExpr.type = (Type *)this;
      pCVar10 = not_null<slang::syntax::CoverageBinInitializerSyntax_*>::operator->
                          ((not_null<slang::syntax::CoverageBinInitializerSyntax_*> *)
                           (buffer.stackBase + 0x18));
      SVar3 = (pCVar10->super_SyntaxNode).kind;
      if (SVar3 != DefaultCoverageBinInitializer) {
        if (SVar3 == ExpressionCoverageBinInitializer) {
          pSVar6 = &not_null<slang::syntax::CoverageBinInitializerSyntax_*>::operator->
                              ((not_null<slang::syntax::CoverageBinInitializerSyntax_*> *)
                               (buffer.stackBase + 0x18))->super_SyntaxNode;
          pEVar15 = slang::syntax::SyntaxNode::
                    as<slang::syntax::ExpressionCoverageBinInitializerSyntax>(pSVar6);
          pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&pEVar15->expr);
          memset(&t,0,8);
          bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&t);
          pEVar9 = bindCovergroupExpr(pEVar7,(ASTContext *)local_60,(Type *)0x0,
                                      (bitmask<slang::ast::ASTFlags>)t);
          this->setCoverageExpr = pEVar9;
          bVar4 = Expression::bad(this->setCoverageExpr);
          if (!bVar4) {
            diag = (Diagnostic *)
                   not_null<const_slang::ast::Type_*>::operator*(&this->setCoverageExpr->type);
            bVar4 = Type::isArray((Type *)diag);
            if ((bVar4) &&
               (bVar4 = Type::isAssociativeArray((Type *)diag), this_00 = binsSyntax, !bVar4)) {
              rhs = Type::getArrayElementType((Type *)diag);
              bVar4 = Type::isAssignmentCompatible((Type *)this_00,rhs);
              if (bVar4) {
                return;
              }
            }
            local_3ec = 0x120006;
            pSVar2 = &this->setCoverageExpr->sourceRange;
            local_400 = pSVar2->startLoc;
            local_3f8 = (this->setCoverageExpr->sourceRange).endLoc;
            local_3e8 = ASTContext::addDiag((ASTContext *)local_60,(DiagCode)0x120006,*pSVar2);
            pDVar13 = ast::operator<<(local_3e8,(Type *)diag);
            psVar1 = &(type->super_Symbol).name;
            local_410 = psVar1->_M_len;
            local_408 = (type->super_Symbol).name._M_str;
            pDVar13 = Diagnostic::operator<<(pDVar13,*psVar1);
            ast::operator<<(pDVar13,(Type *)binsSyntax);
          }
        }
        else if (SVar3 == IdWithExprCoverageBinInitializer) {
          pSVar6 = &not_null<slang::syntax::CoverageBinInitializerSyntax_*>::operator->
                              ((not_null<slang::syntax::CoverageBinInitializerSyntax_*> *)
                               (buffer.stackBase + 0x18))->super_SyntaxNode;
          targetName._M_str =
               (char *)slang::syntax::SyntaxNode::
                       as<slang::syntax::IdWithExprCoverageBinInitializerSyntax>(pSVar6);
          withSyntax = not_null<slang::syntax::WithClauseSyntax_*>::operator*
                                 (&((IdWithExprCoverageBinInitializerSyntax *)targetName._M_str)->
                                   withClause);
          resolve::anon_class_40_5_a2b3541b::operator()
                    ((anon_class_40_5_a2b3541b *)&init,withSyntax);
          _local_1d8 = parsing::Token::valueText((Token *)(targetName._M_str + 0x10));
          bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_1d8);
          if ((!bVar4) &&
             (__y._M_len = (type->super_Symbol).name._M_len,
             __y._M_str = (type->super_Symbol).name._M_str, bVar4 = std::operator!=(_local_1d8,__y),
             bVar4)) {
            sourceRange = parsing::Token::range((Token *)(targetName._M_str + 0x10));
            pDVar13 = ASTContext::addDiag((ASTContext *)local_60,(DiagCode)0x100006,sourceRange);
            psVar1 = &(type->super_Symbol).name;
            listBuffer.stackBase._40_8_ = psVar1->_M_len;
            Diagnostic::operator<<(pDVar13,*psVar1);
          }
        }
        else if (SVar3 == RangeCoverageBinInitializer) {
          SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
                    ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&rcbis);
          pSVar6 = &not_null<slang::syntax::CoverageBinInitializerSyntax_*>::operator->
                              ((not_null<slang::syntax::CoverageBinInitializerSyntax_*> *)
                               (buffer.stackBase + 0x18))->super_SyntaxNode;
          pRVar11 = slang::syntax::SyntaxNode::as<slang::syntax::RangeCoverageBinInitializerSyntax>
                              (pSVar6);
          pOVar12 = not_null<slang::syntax::OpenRangeListSyntax_*>::operator->(&pRVar11->ranges);
          iVar17 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                             (&pOVar12->valueRanges);
          __end3.index = (size_t)iVar17.list;
          iVar17 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                             (&pOVar12->valueRanges);
          while( true ) {
            __end3.list = (ParentList *)iVar17.index;
            elem = (ExpressionSyntax *)iVar17.list;
            bVar4 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                    ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                                  *)&__end3.index,
                                 (iterator_base<slang::syntax::ExpressionSyntax_*> *)&elem);
            if (!bVar4) break;
            flags.m_bits = (underlying_type)
                           slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                           iterator_base<slang::syntax::ExpressionSyntax_*>::operator*
                                     ((iterator_base<slang::syntax::ExpressionSyntax_*> *)
                                      &__end3.index);
            bitmask<slang::ast::ASTFlags>::bitmask(&local_180);
            if (*(int *)(flags.m_bits + 8) == 0x13d) {
              bitmask<slang::ast::ASTFlags>::bitmask
                        ((bitmask<slang::ast::ASTFlags> *)&expr,AllowUnboundedLiteral);
              local_180.m_bits = (underlying_type)expr;
            }
            local_198 = local_180.m_bits;
            local_1a0 = bindCovergroupExpr((ExpressionSyntax *)flags.m_bits,(ASTContext *)local_60,
                                           (Type *)binsSyntax,local_180);
            local_190 = local_1a0;
            SmallVectorBase<const_slang::ast::Expression_*>::push_back
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)&rcbis,&local_1a0);
            iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
            ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                          *)&__end3.index);
            iVar17.index = (size_t)__end3.list;
            iVar17.list = (ParentList *)elem;
          }
          iVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                            ((SmallVectorBase<const_slang::ast::Expression_*> *)&rcbis,
                             (EVP_PKEY_CTX *)context.assertionInstance,src);
          iwecbi = (IdWithExprCoverageBinInitializerSyntax *)CONCAT44(extraout_var_02,iVar5);
          nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
          span<const_slang::ast::Expression_*,_18446744073709551615UL,_0>
                    (&local_1b0,
                     (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)&iwecbi);
          (this->values).data_ = local_1b0.data_;
          (this->values).size_ = local_1b0.size_;
          if (pRVar11->withClause != (WithClauseSyntax *)0x0) {
            resolve::anon_class_40_5_a2b3541b::operator()
                      ((anon_class_40_5_a2b3541b *)&init,pRVar11->withClause);
          }
          SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                    ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&rcbis);
        }
        else {
          if (SVar3 != TransListCoverageBinInitializer) {
            this_04 = (logic_error *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4b0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
                       ,&local_4b1);
            std::operator+(&local_490,&local_4b0,":");
            std::__cxx11::to_string(&local_4d8,0x246);
            std::operator+(&local_470,&local_490,&local_4d8);
            std::operator+(&local_450,&local_470,": ");
            std::operator+(&local_430,&local_450,"Default case should be unreachable!");
            std::logic_error::logic_error(this_04,(string *)&local_430);
            __cxa_throw(this_04,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          SmallVector<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_4UL>
          ::SmallVector((SmallVector<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_4UL>
                         *)&__range3_1);
          pSVar6 = &not_null<slang::syntax::CoverageBinInitializerSyntax_*>::operator->
                              ((not_null<slang::syntax::CoverageBinInitializerSyntax_*> *)
                               (buffer.stackBase + 0x18))->super_SyntaxNode;
          pTVar14 = slang::syntax::SyntaxNode::
                    as<slang::syntax::TransListCoverageBinInitializerSyntax>(pSVar6);
          iVar18 = slang::syntax::SeparatedSyntaxList<slang::syntax::TransSetSyntax>::begin
                             (&pTVar14->sets);
          __end3_1.index = (size_t)iVar18.list;
          iVar18 = slang::syntax::SeparatedSyntaxList<slang::syntax::TransSetSyntax>::end
                             (&pTVar14->sets);
          while( true ) {
            __end3_1.list = (ParentList *)iVar18.index;
            setElem = (TransSetSyntax *)iVar18.list;
            bVar4 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TransSetSyntax>::iterator_base<slang::syntax::TransSetSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::TransSetSyntax_*,_unsigned_long,_slang::syntax::TransSetSyntax_**,_slang::syntax::TransSetSyntax_*&>
                    ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TransSetSyntax>::iterator_base<slang::syntax::TransSetSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::TransSetSyntax_*,_unsigned_long,_slang::syntax::TransSetSyntax_**,_slang::syntax::TransSetSyntax_*&>
                                  *)&__end3_1.index,
                                 (iterator_base<slang::syntax::TransSetSyntax_*> *)&setElem);
            if (!bVar4) break;
            setBuffer.stackBase._112_8_ =
                 slang::syntax::SeparatedSyntaxList<slang::syntax::TransSetSyntax>::
                 iterator_base<slang::syntax::TransSetSyntax_*>::operator*
                           ((iterator_base<slang::syntax::TransSetSyntax_*> *)&__end3_1.index);
            SmallVector<slang::ast::CoverageBinSymbol::TransRangeList,_4UL>::SmallVector
                      ((SmallVector<slang::ast::CoverageBinSymbol::TransRangeList,_4UL> *)&__range4)
            ;
            this_03 = (SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *)
                      (setBuffer.stackBase._112_8_ + 0x20);
            iVar19 = slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>::begin
                               (this_03);
            __end4.index = (size_t)iVar19.list;
            iVar19 = slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>::end
                               (this_03);
            while( true ) {
              __end4.list = (ParentList *)iVar19.index;
              rangeElem = (TransRangeSyntax *)iVar19.list;
              bVar4 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>::iterator_base<slang::syntax::TransRangeSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::TransRangeSyntax_*,_unsigned_long,_slang::syntax::TransRangeSyntax_**,_slang::syntax::TransRangeSyntax_*&>
                      ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>::iterator_base<slang::syntax::TransRangeSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::TransRangeSyntax_*,_unsigned_long,_slang::syntax::TransRangeSyntax_**,_slang::syntax::TransRangeSyntax_*&>
                                    *)&__end4.index,
                                   (iterator_base<slang::syntax::TransRangeSyntax_*> *)&rangeElem);
              if (!bVar4) break;
              local_390 = slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>::
                          iterator_base<slang::syntax::TransRangeSyntax_*>::operator*
                                    ((iterator_base<slang::syntax::TransRangeSyntax_*> *)
                                     &__end4.index);
              SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::
              emplace_back<slang::syntax::TransRangeSyntax&,slang::ast::Type_const&,slang::ast::ASTContext&>
                        ((SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *)&__range4
                         ,local_390,(Type *)binsSyntax,(ASTContext *)local_60);
              iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>::iterator_base<slang::syntax::TransRangeSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::TransRangeSyntax_*,_unsigned_long,_slang::syntax::TransRangeSyntax_**,_slang::syntax::TransRangeSyntax_*&>
              ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>::iterator_base<slang::syntax::TransRangeSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::TransRangeSyntax_*,_unsigned_long,_slang::syntax::TransRangeSyntax_**,_slang::syntax::TransRangeSyntax_*&>
                            *)&__end4.index);
              iVar19.index = (size_t)__end4.list;
              iVar19.list = (ParentList *)rangeElem;
            }
            iVar5 = SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::copy
                              ((SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *)
                               &__range4,(EVP_PKEY_CTX *)context.assertionInstance,src_01);
            local_3b0.data_ = (pointer)CONCAT44(extraout_var_03,iVar5);
            nonstd::span_lite::
            span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>::
            span<slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL,_0>
                      (&local_3a0,&local_3b0);
            SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
            ::push_back((SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                         *)&__range3_1,&local_3a0);
            SmallVector<slang::ast::CoverageBinSymbol::TransRangeList,_4UL>::~SmallVector
                      ((SmallVector<slang::ast::CoverageBinSymbol::TransRangeList,_4UL> *)&__range4)
            ;
            iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TransSetSyntax>::iterator_base<slang::syntax::TransSetSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::TransSetSyntax_*,_unsigned_long,_slang::syntax::TransSetSyntax_**,_slang::syntax::TransSetSyntax_*&>
            ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TransSetSyntax>::iterator_base<slang::syntax::TransSetSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::TransSetSyntax_*,_unsigned_long,_slang::syntax::TransSetSyntax_**,_slang::syntax::TransSetSyntax_*&>
                          *)&__end3_1.index);
            iVar18.index = (size_t)__end3_1.list;
            iVar18.list = (ParentList *)setElem;
          }
          iVar5 = SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                  ::copy((SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                          *)&__range3_1,(EVP_PKEY_CTX *)context.assertionInstance,src_00);
          local_3d0.data_ = (pointer)CONCAT44(extraout_var_04,iVar5);
          nonstd::span_lite::
          span<const_nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>
          ::
          span<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL,_0>
                    (&local_3c0,&local_3d0);
          (this->transList).data_ = local_3c0.data_;
          (this->transList).size_ = local_3c0.size_;
          SmallVector<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_4UL>
          ::~SmallVector((SmallVector<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_4UL>
                          *)&__range3_1);
        }
      }
    }
    return;
  }
  assert::assertFailed
            ("syntax && scope",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
             ,0x1e0,"void slang::ast::CoverageBinSymbol::resolve() const");
}

Assistant:

void CoverageBinSymbol::resolve() const {
    ASSERT(!isResolved);
    isResolved = true;

    auto syntax = getSyntax();
    auto scope = getParentScope();
    ASSERT(syntax && scope);

    auto& comp = scope->getCompilation();
    ASTContext context(*scope, LookupLocation::before(*this));

    if (syntax->kind == SyntaxKind::BinsSelection) {
        auto& binsSyntax = syntax->as<BinsSelectionSyntax>();
        if (binsSyntax.iff) {
            iffExpr = &Expression::bind(*binsSyntax.iff->expr, context,
                                        ASTFlags::AllowCoverageSampleFormal);
            context.requireBooleanConvertible(*iffExpr);
        }

        selectExpr = &BinsSelectExpr::bind(*binsSyntax.expr, context);
        return;
    }

    auto& coverpoint = scope->asSymbol().as<CoverpointSymbol>();
    auto& type = coverpoint.getType();

    auto& binsSyntax = syntax->as<CoverageBinsSyntax>();
    if (binsSyntax.iff) {
        iffExpr = &Expression::bind(*binsSyntax.iff->expr, context,
                                    ASTFlags::AllowCoverageSampleFormal);
        context.requireBooleanConvertible(*iffExpr);
    }

    if (binsSyntax.size && binsSyntax.size->expr) {
        numberOfBinsExpr = &bindCovergroupExpr(*binsSyntax.size->expr, context);
        context.requireIntegral(*numberOfBinsExpr);
    }

    auto bindWithExpr = [&](const WithClauseSyntax& withSyntax) {
        // Create the iterator variable and set it up with an AST context so that it
        // can be found by the iteration expression.
        auto it = comp.emplace<IteratorSymbol>(*context.scope, "item"sv, coverpoint.location, type);

        ASTContext iterCtx = context;
        it->nextTemp = std::exchange(iterCtx.firstTempVar, it);

        withExpr = &bindCovergroupExpr(*withSyntax.expr, iterCtx);
        iterCtx.requireBooleanConvertible(*withExpr);
    };

    auto init = binsSyntax.initializer;
    switch (init->kind) {
        case SyntaxKind::RangeCoverageBinInitializer: {
            SmallVector<const Expression*> buffer;
            auto& rcbis = init->as<RangeCoverageBinInitializerSyntax>();
            for (auto elem : rcbis.ranges->valueRanges) {
                bitmask<ASTFlags> flags;
                if (elem->kind == SyntaxKind::OpenRangeExpression)
                    flags = ASTFlags::AllowUnboundedLiteral;

                auto& expr = bindCovergroupExpr(*elem, context, &type, flags);
                buffer.push_back(&expr);
            }
            values = buffer.copy(comp);

            if (rcbis.withClause)
                bindWithExpr(*rcbis.withClause);
            break;
        }
        case SyntaxKind::IdWithExprCoverageBinInitializer: {
            auto& iwecbi = init->as<IdWithExprCoverageBinInitializerSyntax>();
            bindWithExpr(*iwecbi.withClause);

            auto targetName = iwecbi.id.valueText();
            if (!targetName.empty() && targetName != coverpoint.name)
                context.addDiag(diag::CoverageBinTargetName, iwecbi.id.range()) << coverpoint.name;
            break;
        }
        case SyntaxKind::TransListCoverageBinInitializer: {
            SmallVector<TransSet, 4> listBuffer;
            for (auto setElem : init->as<TransListCoverageBinInitializerSyntax>().sets) {
                SmallVector<TransRangeList, 4> setBuffer;
                for (auto rangeElem : setElem->ranges)
                    setBuffer.emplace_back(*rangeElem, type, context);
                listBuffer.push_back(setBuffer.copy(comp));
            }
            transList = listBuffer.copy(comp);
            break;
        }
        case SyntaxKind::ExpressionCoverageBinInitializer:
            setCoverageExpr = &bindCovergroupExpr(
                *init->as<ExpressionCoverageBinInitializerSyntax>().expr, context);

            if (!setCoverageExpr->bad()) {
                auto& t = *setCoverageExpr->type;
                if (!t.isArray() || t.isAssociativeArray() ||
                    !type.isAssignmentCompatible(*t.getArrayElementType())) {

                    auto& diag = context.addDiag(diag::CoverageSetType,
                                                 setCoverageExpr->sourceRange);
                    diag << t << coverpoint.name << type;
                }
            }
            break;
        case SyntaxKind::DefaultCoverageBinInitializer:
            // Already handled at construction time.
            break;
        default:
            ASSUME_UNREACHABLE;
    }
}